

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioutils.cpp
# Opt level: O0

QString * QMakeInternal::IoUtils::shellQuoteWin(QString *arg)

{
  bool bVar1;
  bool bVar2;
  qsizetype qVar3;
  QString *this;
  QChar *pQVar4;
  char16_t *pcVar5;
  QString *in_RSI;
  QByteArrayView *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  int i;
  bool quoted;
  QString *ret;
  QChar c;
  QString *in_stack_fffffffffffffed8;
  PatternOption flags;
  QString *in_stack_fffffffffffffee0;
  QChar QVar7;
  QByteArrayView *this_00;
  int local_108;
  QLatin1StringView in_stack_ffffffffffffff10;
  QLatin1Char local_dd [3];
  QChar local_da [23];
  uint local_ac;
  undefined1 local_98 [24];
  QRegularExpression local_80 [52];
  uint local_4c;
  undefined1 local_38 [24];
  QRegularExpression local_20 [8];
  storage_type *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  qVar3 = QString::size(in_RSI);
  if (qVar3 == 0) {
    QByteArrayView::QByteArrayView<3ul>(this_00,(char (*) [3])in_RDI);
    QVar6.m_data = local_18;
    QVar6.m_size = (qsizetype)in_RDI;
    QString::fromLatin1(QVar6);
  }
  else {
    ((DataPointer *)&in_RDI->m_size)->d = (Data *)0xaaaaaaaaaaaaaaaa;
    in_RDI->m_data = (storage_type *)0xaaaaaaaaaaaaaaaa;
    in_RDI[1].m_size = -0x5555555555555556;
    QString::QString(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    flags = (PatternOption)((ulong)in_stack_fffffffffffffed8 >> 0x20);
    bVar1 = hasSpecialChars((QString *)in_RDI,(uchar (*) [16])in_stack_fffffffffffffee0);
    if (bVar1) {
      QLatin1String::QLatin1String((QLatin1String *)this_00,(char *)in_RDI);
      QString::QString((QString *)this_00,in_stack_ffffffffffffff10);
      QFlags<QRegularExpression::PatternOption>::QFlags
                ((QFlags<QRegularExpression::PatternOption> *)in_stack_fffffffffffffee0,flags);
      QRegularExpression::QRegularExpression
                (local_20,(QString *)local_38,(QFlags_conflict *)(ulong)local_4c);
      QLatin1String::QLatin1String((QLatin1String *)this_00,(char *)in_RDI);
      QString::QString((QString *)this_00,in_stack_ffffffffffffff10);
      QString::replace((QRegularExpression *)in_RDI,(QString *)local_20);
      QString::~QString((QString *)0x2c3868);
      QRegularExpression::~QRegularExpression(local_20);
      QString::~QString((QString *)0x2c3882);
      QLatin1String::QLatin1String((QLatin1String *)this_00,(char *)in_RDI);
      QString::QString((QString *)this_00,in_stack_ffffffffffffff10);
      QFlags<QRegularExpression::PatternOption>::QFlags
                ((QFlags<QRegularExpression::PatternOption> *)in_stack_fffffffffffffee0,flags);
      QRegularExpression::QRegularExpression
                (local_80,(QString *)local_98,(QFlags_conflict *)(ulong)local_ac);
      QLatin1String::QLatin1String((QLatin1String *)this_00,(char *)in_RDI);
      QString::QString((QString *)this_00,in_stack_ffffffffffffff10);
      QString::replace((QRegularExpression *)in_RDI,(QString *)local_80);
      QString::~QString((QString *)0x2c391e);
      QRegularExpression::~QRegularExpression(local_80);
      QString::~QString((QString *)0x2c3938);
      bVar1 = true;
      local_108 = 0;
      while( true ) {
        this = (QString *)(long)local_108;
        qVar3 = QString::size((QString *)in_RDI);
        if (qVar3 <= (long)this) break;
        local_da[0].ucs = L'ꪪ';
        pQVar4 = QString::unicode((QString *)0x2c3980);
        local_da[0].ucs = pQVar4[local_108].ucs;
        pcVar5 = QChar::unicode(local_da);
        if (*pcVar5 == L'\"') {
          bVar1 = (bool)(bVar1 ^ 1);
        }
        else if (!bVar1) {
          pcVar5 = QChar::unicode(local_da);
          bVar2 = isSpecialChar(*pcVar5,(uchar (*) [16])"");
          if (bVar2) {
            QVar7.ucs = (char16_t)local_108;
            QLatin1Char::QLatin1Char(local_dd,'^');
            QChar::QChar<QLatin1Char,_true>
                      ((QChar *)this,(QLatin1Char)(char)((ulong)in_RDI >> 0x38));
            QString::insert((longlong)in_RDI,QVar7);
            local_108 = local_108 + 1;
          }
        }
        local_108 = local_108 + 1;
      }
      if (!bVar1) {
        QLatin1Char::QLatin1Char((QLatin1Char *)&stack0xffffffffffffff1f,'^');
        QChar::QChar<QLatin1Char,_true>((QChar *)this,(QLatin1Char)(char)((ulong)in_RDI >> 0x38));
        QString::append((QChar)(char16_t)in_RDI);
      }
      QLatin1Char::QLatin1Char((QLatin1Char *)&stack0xffffffffffffff1b,'\"');
      QChar::QChar<QLatin1Char,_true>((QChar *)this,(QLatin1Char)(char)((ulong)in_RDI >> 0x38));
      QString::append((QChar)(char16_t)in_RDI);
      QVar7.ucs = (char16_t)((ulong)in_RDI >> 0x30);
      QLatin1Char::QLatin1Char((QLatin1Char *)&stack0xffffffffffffff17,'\"');
      QChar::QChar<QLatin1Char,_true>((QChar *)this,(QLatin1Char)(char)((ushort)QVar7.ucs >> 8));
      QString::prepend(this,QVar7);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QString IoUtils::shellQuoteWin(const QString &arg)
{
    // Chars that should be quoted (TM). This includes:
    // - control chars & space
    // - the shell meta chars "&()<>^|
    // - the potential separators ,;=
    static const uchar iqm[] = {
        0xff, 0xff, 0xff, 0xff, 0x45, 0x13, 0x00, 0x78,
        0x00, 0x00, 0x00, 0x40, 0x00, 0x00, 0x00, 0x10
    };
    // Shell meta chars that need escaping.
    static const uchar ism[] = {
        0x00, 0x00, 0x00, 0x00, 0x40, 0x03, 0x00, 0x50,
        0x00, 0x00, 0x00, 0x40, 0x00, 0x00, 0x00, 0x10
    }; // &()<>^|

    if (!arg.size())
        return QString::fromLatin1("\"\"");

    QString ret(arg);
    if (hasSpecialChars(ret, iqm)) {
        // The process-level standard quoting allows escaping quotes with backslashes (note
        // that backslashes don't escape themselves, unless they are followed by a quote).
        // Consequently, quotes are escaped and their preceding backslashes are doubled.
        ret.replace(QRegularExpression(QLatin1String("(\\\\*)\"")), QLatin1String("\\1\\1\\\""));
        // Trailing backslashes must be doubled as well, as they are followed by a quote.
        ret.replace(QRegularExpression(QLatin1String("(\\\\+)$")), QLatin1String("\\1\\1"));
        // However, the shell also interprets the command, and no backslash-escaping exists
        // there - a quote always toggles the quoting state, but is nonetheless passed down
        // to the called process verbatim. In the unquoted state, the circumflex escapes
        // meta chars (including itself and quotes), and is removed from the command.
        bool quoted = true;
        for (int i = 0; i < ret.size(); i++) {
            QChar c = ret.unicode()[i];
            if (c.unicode() == '"')
                quoted = !quoted;
            else if (!quoted && isSpecialChar(c.unicode(), ism))
                ret.insert(i++, QLatin1Char('^'));
        }
        if (!quoted)
            ret.append(QLatin1Char('^'));
        ret.append(QLatin1Char('"'));
        ret.prepend(QLatin1Char('"'));
    }
    return ret;
}